

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_primitive_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutablePrimitiveFieldGenerator::GenerateEqualsCode
          (ImmutablePrimitiveFieldGenerator *this,Printer *printer)

{
  JavaType JVar1;
  LogMessage *pLVar2;
  LogMessage local_58 [63];
  LogFinisher local_19;
  
  JVar1 = GetJavaType(this->descriptor_);
  switch(JVar1) {
  case JAVATYPE_INT:
  case JAVATYPE_LONG:
  case JAVATYPE_BOOLEAN:
    break;
  case JAVATYPE_FLOAT:
    break;
  case JAVATYPE_DOUBLE:
    break;
  case JAVATYPE_STRING:
  case JAVATYPE_BYTES:
    break;
  default:
    google::protobuf::internal::LogMessage::LogMessage
              (local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/compiler/java/java_primitive_field.cc"
               ,0x1a6);
    pLVar2 = (LogMessage *)
             google::protobuf::internal::LogMessage::operator<<(local_58,"Can\'t get here.");
    google::protobuf::internal::LogFinisher::operator=(&local_19,pLVar2);
    google::protobuf::internal::LogMessage::~LogMessage(local_58);
    return;
  }
  google::protobuf::io::Printer::Print((map *)printer,(char *)&this->variables_);
  return;
}

Assistant:

void ImmutablePrimitiveFieldGenerator::GenerateEqualsCode(
    io::Printer* printer) const {
  switch (GetJavaType(descriptor_)) {
    case JAVATYPE_INT:
    case JAVATYPE_LONG:
    case JAVATYPE_BOOLEAN:
      printer->Print(variables_,
                     "if (get$capitalized_name$()\n"
                     "    != other.get$capitalized_name$()) return false;\n");
      break;

    case JAVATYPE_FLOAT:
      printer->Print(
          variables_,
          "if (java.lang.Float.floatToIntBits(get$capitalized_name$())\n"
          "    != java.lang.Float.floatToIntBits(\n"
          "        other.get$capitalized_name$())) return false;\n");
      break;

    case JAVATYPE_DOUBLE:
      printer->Print(
          variables_,
          "if (java.lang.Double.doubleToLongBits(get$capitalized_name$())\n"
          "    != java.lang.Double.doubleToLongBits(\n"
          "        other.get$capitalized_name$())) return false;\n");
      break;

    case JAVATYPE_STRING:
    case JAVATYPE_BYTES:
      printer->Print(
          variables_,
          "if (!get$capitalized_name$()\n"
          "    .equals(other.get$capitalized_name$())) return false;\n");
      break;

    case JAVATYPE_ENUM:
    case JAVATYPE_MESSAGE:
    default:
      GOOGLE_LOG(FATAL) << "Can't get here.";
      break;
  }
}